

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

FloatFormat * tcu::FloatFormat::nativeFloat(void)

{
  FloatFormat *in_RDI;
  
  nativeFormat<float>();
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeFloat (void)
{
	return nativeFormat<float>();
}